

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,StringRef text,XmlFormatting fmt)

{
  ostream *poVar1;
  
  ensureTagClosed(this);
  if ((fmt & Indent) != None) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->m_os,(this->m_indent)._M_dataplus._M_p,(this->m_indent)._M_string_length);
  }
  poVar1 = this->m_os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<!-- ",5);
  poVar1 = (ostream *)std::ostream::write((char *)poVar1,(long)text.m_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -->",4);
  this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeComment( StringRef text, XmlFormatting fmt ) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!-- " << text << " -->";
        applyFormatting(fmt);
        return *this;
    }